

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void hybrid_intra_mode_search
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_cost,BLOCK_SIZE bsize,
               PICK_MODE_CONTEXT *ctx)

{
  byte in_CL;
  long in_RSI;
  long in_RDI;
  uint var_thresh [3];
  int hybrid_intra_pickmode;
  int use_rdopt;
  int64_t in_stack_00000048;
  PICK_MODE_CONTEXT *in_stack_00000050;
  BLOCK_SIZE in_stack_0000005f;
  RD_STATS *in_stack_00000060;
  macroblock *in_stack_00000068;
  AV1_COMP *in_stack_00000070;
  PICK_MODE_CONTEXT *in_stack_000000c0;
  BLOCK_SIZE in_stack_000000cf;
  RD_STATS *in_stack_000000d0;
  MACROBLOCK *in_stack_000000d8;
  AV1_COMP *in_stack_000000e0;
  uint local_3c [4];
  uint local_2c;
  
  local_2c = 0;
  local_3c[3] = *(int *)(in_RDI + 0x60ce0);
  if ((local_3c[3] != 0) && (in_CL < 6)) {
    local_3c[0] = 0;
    local_3c[1] = 0x65;
    local_3c[2] = 0xc9;
    local_2c = (uint)(local_3c[(int)(local_3c[3] + -1)] <= *(uint *)(in_RSI + 0x25640));
  }
  if (local_2c == 0) {
    av1_nonrd_pick_intra_mode
              (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0,in_stack_000000cf,
               in_stack_000000c0);
  }
  else {
    av1_rd_pick_intra_mode_sb
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005f,
               in_stack_00000050,in_stack_00000048);
  }
  return;
}

Assistant:

static inline void hybrid_intra_mode_search(AV1_COMP *cpi, MACROBLOCK *const x,
                                            RD_STATS *rd_cost, BLOCK_SIZE bsize,
                                            PICK_MODE_CONTEXT *ctx) {
  int use_rdopt = 0;
  const int hybrid_intra_pickmode = cpi->sf.rt_sf.hybrid_intra_pickmode;
  // Use rd pick for intra mode search based on block size and variance.
  if (hybrid_intra_pickmode && bsize < BLOCK_16X16) {
    unsigned int var_thresh[3] = { 0, 101, 201 };
    assert(hybrid_intra_pickmode <= 3);
    if (x->source_variance >= var_thresh[hybrid_intra_pickmode - 1])
      use_rdopt = 1;
  }

  if (use_rdopt)
    av1_rd_pick_intra_mode_sb(cpi, x, rd_cost, bsize, ctx, INT64_MAX);
  else
    av1_nonrd_pick_intra_mode(cpi, x, rd_cost, bsize, ctx);
}